

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int hydro_unpad(uchar *buf,size_t padded_buflen,size_t blocksize)

{
  ulong uVar1;
  size_t is_barrier;
  size_t i;
  size_t pad_len;
  uchar valid;
  uchar c;
  uchar acc;
  uchar *tail;
  size_t blocksize_local;
  size_t padded_buflen_local;
  uchar *buf_local;
  int local_4;
  
  acc = '\0';
  valid = '\0';
  pad_len = 0;
  if ((padded_buflen < blocksize) || (blocksize == 0)) {
    local_4 = -1;
  }
  else {
    for (i = 0; i < blocksize; i = i + 1) {
      uVar1 = ((ulong)(acc - 1) & pad_len - 1 & (ulong)((buf[(padded_buflen - 1) - i] ^ 0x80) - 1))
              >> 8 & 1;
      acc = acc | buf[(padded_buflen - 1) - i];
      pad_len = pad_len | i & (uVar1 ^ 0xffffffffffffffff) + 1;
      valid = valid | (byte)uVar1;
    }
    if (valid == '\0') {
      local_4 = -1;
    }
    else {
      local_4 = ((int)padded_buflen + -1) - (int)pad_len;
    }
  }
  return local_4;
}

Assistant:

int
hydro_unpad(const unsigned char *buf, size_t padded_buflen, size_t blocksize)
{
    const unsigned char *tail;
    unsigned char        acc = 0U;
    unsigned char        c;
    unsigned char        valid   = 0U;
    volatile size_t      pad_len = 0U;
    size_t               i;
    size_t               is_barrier;

    if (padded_buflen < blocksize || blocksize <= 0U) {
        return -1;
    }
    tail = &buf[padded_buflen - 1U];

    for (i = 0U; i < blocksize; i++) {
        c          = *(tail - i);
        is_barrier = (((acc - 1U) & (pad_len - 1U) & ((c ^ 0x80) - 1U)) >> 8) & 1U;
        acc |= c;
        pad_len |= i & (1U + ~is_barrier);
        valid |= (unsigned char) is_barrier;
    }
    if (valid == 0) {
        return -1;
    }
    return (int) (padded_buflen - 1 - pad_len);
}